

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManRefSelect_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  Rfn_Obj_t RVar2;
  int *piVar3;
  int iVar4;
  Rfn_Obj_t *pRVar5;
  Rfn_Obj_t *pRVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *p_00;
  bool bVar16;
  
  uVar11 = (ulong)(uint)f;
  pGVar9 = p->pGia;
  pGVar8 = pGVar9->pObjs;
  if (pGVar8 <= pObj) {
    do {
      while( true ) {
        if (pGVar8 + pGVar9->nObjs <= pObj) goto LAB_005883e4;
        pVVar15 = p->pvRefis + (int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555;
        Vec_IntFillExtra(pVVar15,f + 1,(int)uVar11);
        if ((f < 0) || (pVVar15->nSize <= f)) goto LAB_00588403;
        piVar3 = pVVar15->pArray;
        if ((piVar3[(uint)f] & 2U) != 0) {
          return;
        }
        if (p->pPars->fPropFanout == 0) {
          uVar13 = piVar3[(uint)f] | 2;
          piVar3[(uint)f] = uVar13;
          uVar12 = extraout_RDX;
        }
        else {
          Gia_ManRefSetAndPropFanout_rec(p,pObj,f,vSelect,Sign);
          uVar13 = piVar3[(uint)f];
          uVar12 = extraout_RDX_00;
        }
        if ((uVar13 & 4) != 0) goto LAB_005882c8;
        pGVar9 = p->pGia;
        pGVar8 = *(Gia_Obj_t **)pObj;
        uVar13 = (uint)pGVar8;
        if ((~uVar13 & 0x9fffffff) == 0) break;
        if ((~(ulong)pGVar8 & 0x1fffffff1fffffff) == 0) {
          return;
        }
        if (((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x1a5,
                        "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                       );
        }
        pRVar5 = Gla_ObjRef((Gla_Man_t *)pGVar9,(Gia_Obj_t *)p->pvRefis,
                            (int)pObj + (uVar13 & 0x1fffffff) * -0xc);
        pRVar6 = Gla_ObjRef((Gla_Man_t *)p->pGia,(Gia_Obj_t *)p->pvRefis,
                            (int)pObj + (*(uint *)&pObj->field_0x4 & 0x1fffffff) * -0xc);
        RVar1 = *pRVar5;
        if ((*(byte *)(piVar3 + (uint)f) & 1) == 0) {
          uVar7 = *(ulong *)pObj;
          RVar2 = *pRVar6;
          uVar11 = (ulong)(uint)RVar2;
          uVar13 = (uint)(uVar7 >> 0x3d) ^ (uint)RVar2;
          if ((((uint)(uVar7 >> 0x1d) & 7 ^ (uint)RVar1) & 1) == 0) {
            if ((uVar13 & 1) == 0) {
              uVar13 = (uint)RVar1 >> 3 & 0xffff;
              uVar10 = (uint)RVar2 >> 3 & 0xffff;
              uVar11 = (ulong)uVar10;
              if (uVar10 < uVar13) {
                if (uVar10 == 0) {
                  return;
                }
                goto LAB_0058820f;
              }
            }
            else {
              uVar13 = (uint)RVar1 & 0x7fff8;
            }
            if (uVar13 == 0) {
              return;
            }
          }
          else {
            if ((uVar13 & 1) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x1a2,
                            "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                           );
            }
            if (((uint)RVar2 & 0x7fff8) == 0) {
              return;
            }
LAB_0058820f:
            uVar7 = uVar7 >> 0x20;
          }
        }
        else {
          uVar11 = extraout_RDX_01;
          if (((uint)RVar1 & 0x7fff8) != 0) {
            Gla_ManRefSelect_rec
                      (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect,Sign);
            uVar11 = extraout_RDX_02;
          }
          if (((uint)*pRVar6 & 0x7fff8) == 0) {
            return;
          }
          uVar7 = (ulong)*(uint *)&pObj->field_0x4;
        }
        pObj = pObj + -(ulong)((uint)uVar7 & 0x1fffffff);
        pGVar9 = p->pGia;
        pGVar8 = pGVar9->pObjs;
        if (pObj < pGVar8) goto LAB_005883e4;
      }
      bVar16 = f == 0;
      f = f - 1;
      if ((~(ulong)pGVar8 & 0x1fffffff1fffffff) == 0) {
        return;
      }
      if ((int)((uint)((ulong)pGVar8 >> 0x20) & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs) {
        return;
      }
      if (bVar16) {
        return;
      }
      pGVar8 = Gia_ObjRoToRi(pGVar9,pGVar8);
      pObj = pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff);
      pGVar9 = p->pGia;
      pGVar8 = pGVar9->pObjs;
      uVar11 = extraout_RDX_03;
    } while (pGVar8 <= pObj);
  }
LAB_005883e4:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
LAB_005882c8:
  if ((uVar13 & 0x7fff8) == 0) {
    __assert_fail("(int)pRef->Prio > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                  ,0x168,
                  "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)");
  }
  if (p->pPars->fPropFanout == 0) {
    pGVar8 = p->pGia->pObjs;
    if ((pGVar8 <= pObj) && (pObj < pGVar8 + p->pGia->nObjs)) {
      Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555);
      if (f < p->vObjCounts->nSize) {
        piVar3 = p->vObjCounts->pArray + (uint)f;
        *piVar3 = *piVar3 + 1;
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
  else {
    lVar14 = (long)p->pPars->iFrame;
    if (lVar14 < 0) {
      return;
    }
    while( true ) {
      pGVar8 = p->pGia->pObjs;
      if ((pObj < pGVar8) || (pGVar8 + p->pGia->nObjs <= pObj)) break;
      pVVar15 = p->pvRefis;
      iVar4 = (int)((ulong)((long)pObj - (long)pGVar8) >> 2) * -0x55555555;
      p_00 = pVVar15 + iVar4;
      Vec_IntFillExtra(p_00,(int)lVar14 + 1,(int)uVar12);
      if (pVVar15[iVar4].nSize <= lVar14) {
LAB_00588403:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar12 = extraout_RDX_04;
      if ((*(byte *)(p_00->pArray + lVar14) & 2) == 0) {
        Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)lVar14,vSelect,Sign);
        uVar12 = extraout_RDX_05;
      }
      bVar16 = lVar14 < 1;
      lVar14 = lVar14 + -1;
      if (bVar16) {
        return;
      }
    }
  }
  goto LAB_005883e4;
}

Assistant:

void Gla_ManRefSelect_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{ 
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef = Gla_ObjRef( p, pObj, f );
//    assert( (int)pRef->Sign == Sign );
    if ( pRef->fVisit )
        return;
    if ( p->pPars->fPropFanout )
        Gia_ManRefSetAndPropFanout_rec( p, pObj, f, vSelect, Sign );
    else
        pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        if ( p->pPars->fPropFanout )
        {
            for ( i = p->pPars->iFrame; i >= 0; i-- )
                if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                    Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
            Vec_IntAddToEntry( p->vObjCounts, f, 1 );
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect, Sign );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rfn_Obj_t * pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
        Rfn_Obj_t * pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
        if ( pRef->Value == 1 )
        {
            if ( pRef0->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            if ( pRef1->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
        }
        else // select one value
        {
            if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef0->Prio <= pRef1->Prio ) // choice
                {
                    if ( pRef0->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
                }
                else
                {
                    if ( pRef1->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
                }
            }
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRef0->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            }
            else if ( (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef1->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}